

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::
parse_format_string<false,char,duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          *handler)

{
  ulong uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  internal *piVar4;
  undefined8 uVar5;
  format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *this_00;
  buffer<char> *c;
  internal *end;
  pfs_writer write;
  pfs_writer local_a0;
  id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&,_char>
  local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = (format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
             *)format_str.size_;
  if (format_str.data_ != (char *)0x0) {
    end = (internal *)(format_str.data_ + (long)this);
    local_a0.handler_ = this_00;
    do {
      piVar4 = this;
      if ((*this != (internal)0x7b) &&
         (piVar4 = (internal *)memchr(this,0x7b,(long)end - (long)this), piVar4 == (internal *)0x0))
      {
        parse_format_string<false,_char,_duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&>
        ::pfs_writer::operator()(&local_a0,(char *)this,(char *)end);
        return;
      }
      parse_format_string<false,_char,_duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&>
      ::pfs_writer::operator()(&local_a0,(char *)this,(char *)piVar4);
      piVar4 = piVar4 + 1;
      if (piVar4 == end) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"invalid format string","");
        duckdb_fmt::v6::internal::error_handler::on_error(this_00,(string *)local_50);
        goto LAB_0075bae9;
      }
      if (*piVar4 == (internal)0x7b) {
        pbVar2 = (this_00->context).out_.container;
        sVar3 = pbVar2->size_;
        uVar1 = sVar3 + 1;
        if (pbVar2->capacity_ < uVar1) {
          (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
        }
        pbVar2->size_ = uVar1;
        *(internal *)(pbVar2->ptr_ + sVar3) = *piVar4;
        (this_00->context).out_.container = pbVar2;
      }
      else {
        if (*piVar4 != (internal)0x7d) {
          local_98.handler = this_00;
          piVar4 = (internal *)
                   parse_arg_id<char,duckdb_fmt::v6::internal::id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>&,char>>
                             ((char *)piVar4,(char *)end,&local_98);
          if (piVar4 != end) {
            if (*piVar4 == (internal)0x3a) {
              piVar4 = (internal *)
                       format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                       ::on_format_specs(this_00,(char *)(piVar4 + 1),(char *)end);
              if ((piVar4 == end) || (*piVar4 != (internal)0x7d)) goto LAB_0075bb18;
              goto LAB_0075ba8d;
            }
            if (*piVar4 == (internal)0x7d) goto LAB_0075ba5a;
          }
LAB_0075bae9:
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"missing \'}\' in format string","");
          duckdb_fmt::v6::internal::error_handler::on_error(this_00,(string *)local_90);
LAB_0075bb18:
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"unknown format specifier","");
          uVar5 = duckdb_fmt::v6::internal::error_handler::on_error(this_00,(string *)local_70);
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          _Unwind_Resume(uVar5);
        }
        format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_arg_id(this_00);
LAB_0075ba5a:
        format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_replacement_field(this_00,(char *)piVar4);
      }
LAB_0075ba8d:
      this = piVar4 + 1;
    } while (this != end);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct pfs_writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}